

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract.h
# Opt level: O0

void __thiscall Abstract<8U>::print_f1(Abstract<8U> *this,ofstream *out,int num)

{
  ostream *poVar1;
  long in_RDI;
  double local_38;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)(in_RDI + 8));
  poVar1 = std::operator<<(poVar1,(string *)(in_RDI + 0x48));
  if (1e-06 <= *(double *)(in_RDI + 0x30) + *(double *)(in_RDI + 0x28)) {
    local_38 = *(double *)(in_RDI + 0x30) + *(double *)(in_RDI + 0x28);
  }
  else {
    local_38 = 1.0;
  }
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(*(double *)(in_RDI + 0x28) * 2.0 * *(double *)(in_RDI + 0x30)) /
                             local_38);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void print_f1(ofstream& out, int num) {
		cout << name << sep << 2 * this->pr * this->cr / ((this->cr + this->pr < 1e-6) ? 1 : this->cr + pr) << endl;
	}